

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O0

Aig_Obj_t * Abc_NtkConstructAig_rec(Mfs_Man_t *p,Abc_Obj_t *pNode,Aig_Man_t *pMan)

{
  int iVar1;
  void *pvVar2;
  Abc_Obj_t *pObjOld;
  Abc_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_3c;
  int i;
  Abc_Obj_t *pObj;
  Aig_Obj_t *pExor;
  Aig_Obj_t *pRoot;
  Aig_Man_t *pMan_local;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vSupp), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar2 = Vec_PtrEntry(p->vSupp,local_3c);
    pAVar4 = Aig_ObjCreateCi(pMan);
    *(Aig_Obj_t **)((long)pvVar2 + 8) = pAVar4;
    *(Aig_Obj_t **)((long)pvVar2 + 0x40) = pAVar4;
  }
  Abc_NtkIncrementTravId(pNode->pNtk);
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
    pObjOld = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,local_3c);
    Abc_MfsConvertHopToAig(pObjOld,pMan);
    if (pObjOld == pNode) {
      pAVar3 = Abc_ObjNot(pObjOld->pNext);
      pObjOld->pNext = pAVar3;
    }
  }
  pExor = Aig_ManConst0(pMan);
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vRoots), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar2 = Vec_PtrEntry(p->vRoots,local_3c);
    pAVar4 = Aig_Exor(pMan,*(Aig_Obj_t **)((long)pvVar2 + 0x40),*(Aig_Obj_t **)((long)pvVar2 + 8));
    pExor = Aig_Or(pMan,pExor,pAVar4);
  }
  return pExor;
}

Assistant:

Aig_Obj_t * Abc_NtkConstructAig_rec( Mfs_Man_t * p, Abc_Obj_t * pNode, Aig_Man_t * pMan )
{
    Aig_Obj_t * pRoot, * pExor;
    Abc_Obj_t * pObj;
    int i;
    // assign AIG nodes to the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pObj, i )
        pObj->pCopy = pObj->pNext = (Abc_Obj_t *)Aig_ObjCreateCi( pMan );
    // strash intermediate nodes
    Abc_NtkIncrementTravId( pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        Abc_MfsConvertHopToAig( pObj, pMan );
        if ( pObj == pNode )
            pObj->pNext = Abc_ObjNot(pObj->pNext);
    }
    // create the observability condition
    pRoot = Aig_ManConst0(pMan);
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        pExor = Aig_Exor( pMan, (Aig_Obj_t *)pObj->pCopy, (Aig_Obj_t *)pObj->pNext );
        pRoot = Aig_Or( pMan, pRoot, pExor );
    }
    return pRoot;
}